

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ir.c
# Opt level: O1

void lj_ir_growtop(jit_State *J)

{
  uint uVar1;
  void *pvVar2;
  IRIns *pIVar3;
  int iVar4;
  IRRef IVar5;
  
  uVar1 = J->irbotlim;
  if (J->irtoplim == uVar1) {
    pvVar2 = lj_mem_realloc(J->L,(void *)0x0,0,0x100);
    J->irbotlim = 0x7ff8;
    IVar5 = 0x8018;
  }
  else {
    iVar4 = J->irtoplim - uVar1;
    pvVar2 = lj_mem_realloc(J->L,J->irbuf + uVar1,iVar4 * 8,iVar4 * 0x10);
    IVar5 = iVar4 * 2 + J->irbotlim;
  }
  J->irtoplim = IVar5;
  pIVar3 = (IRIns *)((long)pvVar2 + (ulong)J->irbotlim * -8);
  J->irbuf = pIVar3;
  (J->cur).ir = pIVar3;
  return;
}

Assistant:

void LJ_FASTCALL lj_ir_growtop(jit_State *J)
{
  IRIns *baseir = J->irbuf + J->irbotlim;
  MSize szins = J->irtoplim - J->irbotlim;
  if (szins) {
    baseir = (IRIns *)lj_mem_realloc(J->L, baseir, szins*sizeof(IRIns),
				     2*szins*sizeof(IRIns));
    J->irtoplim = J->irbotlim + 2*szins;
  } else {
    baseir = (IRIns *)lj_mem_realloc(J->L, NULL, 0, LJ_MIN_IRSZ*sizeof(IRIns));
    J->irbotlim = REF_BASE - LJ_MIN_IRSZ/4;
    J->irtoplim = J->irbotlim + LJ_MIN_IRSZ;
  }
  J->cur.ir = J->irbuf = baseir - J->irbotlim;
}